

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O3

void __thiscall FBaseCVar::SetGenericRep(FBaseCVar *this,UCVarValue value,ECVarType type)

{
  uint uVar1;
  FLatchedValue *pFVar2;
  ulong uVar3;
  
  uVar1 = this->Flags;
  if (((uVar1 & 8) == 0) || (!m_DoNoSet)) {
    if (((uVar1 & 0x10) == 0) || ((gamestate == GS_FULLCONSOLE || (gamestate == GS_STARTUP)))) {
      if ((((byte)uVar1 >> 2 & gamestate != GS_STARTUP) == 1) && (!demoplayback)) {
        if ((netgame) && ((&DAT_017e1fd1)[(long)consoleplayer * 0x2a0] == '\0')) {
          Printf("Only setting controllers can change %s\n",this->Name);
          return;
        }
        D_SendServerInfoChange(this,value,type);
        return;
      }
      ForceSet(this,value,type,false);
      return;
    }
    if (type == CVAR_String) {
      value.String = copystring(value.String);
    }
    TArray<FLatchedValue,_FLatchedValue>::Grow(&LatchedValues,1);
    pFVar2 = LatchedValues.Array;
    uVar3 = (ulong)LatchedValues.Count;
    LatchedValues.Array[uVar3].Variable = this;
    pFVar2[uVar3].Value = value;
    pFVar2[uVar3].Type = type;
    LatchedValues.Count = LatchedValues.Count + 1;
  }
  return;
}

Assistant:

void FBaseCVar::SetGenericRep (UCVarValue value, ECVarType type)
{
	if ((Flags & CVAR_NOSET) && m_DoNoSet)
	{
		return;
	}
	else if ((Flags & CVAR_LATCH) && gamestate != GS_FULLCONSOLE && gamestate != GS_STARTUP)
	{
		FLatchedValue latch;

		latch.Variable = this;
		latch.Type = type;
		if (type != CVAR_String)
			latch.Value = value;
		else
			latch.Value.String = copystring(value.String);
		LatchedValues.Push (latch);
	}
	else if ((Flags & CVAR_SERVERINFO) && gamestate != GS_STARTUP && !demoplayback)
	{
		if (netgame && !players[consoleplayer].settings_controller)
		{
			Printf ("Only setting controllers can change %s\n", Name);
			return;
		}
		D_SendServerInfoChange (this, value, type);
	}
	else
	{
		ForceSet (value, type);
	}
}